

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O2

FT_Error TT_Get_MM_Blend(TT_Face face,FT_UInt num_coords,FT_Fixed *coords)

{
  FT_Error FVar1;
  ulong uVar2;
  ulong uVar3;
  GX_Blend pGVar4;
  
  pGVar4 = face->blend;
  if (pGVar4 == (GX_Blend)0x0) {
    FVar1 = TT_Get_MM_Var(face,(FT_MM_Var **)0x0);
    if (FVar1 != 0) {
      return FVar1;
    }
    pGVar4 = face->blend;
  }
  if ((pGVar4->coords != (FT_Fixed *)0x0) ||
     (FVar1 = tt_set_mm_blend(face,0,(FT_Fixed *)0x0,'\x01'), FVar1 == 0)) {
    uVar2 = (ulong)pGVar4->num_axis;
    if (num_coords <= pGVar4->num_axis) {
      uVar2 = (ulong)num_coords;
    }
    if (face->doblend == '\0') {
      for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        coords[uVar3] = 0;
      }
    }
    else {
      for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        coords[uVar3] = pGVar4->normalizedcoords[uVar3];
      }
    }
    for (; uVar2 < num_coords; uVar2 = uVar2 + 1) {
      coords[uVar2] = 0;
    }
    FVar1 = 0;
  }
  return FVar1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Get_MM_Blend( TT_Face    face,
                   FT_UInt    num_coords,
                   FT_Fixed*  coords )
  {
    FT_Error  error = FT_Err_Ok;
    GX_Blend  blend;
    FT_UInt   i, nc;


    if ( !face->blend )
    {
      if ( FT_SET_ERROR( TT_Get_MM_Var( face, NULL ) ) )
        return error;
    }

    blend = face->blend;

    if ( !blend->coords )
    {
      /* select default instance coordinates */
      /* if no instance is selected yet      */
      if ( FT_SET_ERROR( tt_set_mm_blend( face, 0, NULL, 1 ) ) )
        return error;
    }

    nc = num_coords;
    if ( num_coords > blend->num_axis )
    {
      FT_TRACE2(( "TT_Get_MM_Blend:"
                  " only using first %d of %d coordinates\n",
                  blend->num_axis, num_coords ));
      nc = blend->num_axis;
    }

    if ( face->doblend )
    {
      for ( i = 0; i < nc; i++ )
        coords[i] = blend->normalizedcoords[i];
    }
    else
    {
      for ( i = 0; i < nc; i++ )
        coords[i] = 0;
    }

    for ( ; i < num_coords; i++ )
      coords[i] = 0;

    return FT_Err_Ok;
  }